

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureLevelStateQueryTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureLevelWidthCase::checkTextureState
          (TextureLevelWidthCase *this,CallLogWrapper *gl,TextureGenerationSpec *spec)

{
  bool bVar1;
  pointer pTVar2;
  pointer pTVar3;
  bool bVar4;
  long lVar5;
  int levelNdx;
  long lVar6;
  
  pTVar3 = (spec->levels).
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pTVar2 = (spec->levels).
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pTVar3 != pTVar2) {
    bVar4 = true;
    lVar5 = 0;
    for (lVar6 = 0; lVar6 < (int)(((long)pTVar2 - (long)pTVar3) / 0x18); lVar6 = lVar6 + 1) {
      bVar1 = verifyTextureLevelParameterEqual
                        (gl,spec->queryTarget,*(int *)((long)&pTVar3->level + lVar5),0x1000,
                         *(int *)((long)&pTVar3->width + lVar5),
                         (this->super_TextureLevelCommonCase).super_TextureLevelCase.m_type);
      bVar4 = bVar4 && bVar1;
      pTVar3 = (spec->levels).
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pTVar2 = (spec->levels).
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      lVar5 = lVar5 + 0x18;
    }
    return bVar4;
  }
  bVar4 = verifyTextureLevelParameterEqual
                    (gl,spec->queryTarget,0,0x1000,0,
                     (this->super_TextureLevelCommonCase).super_TextureLevelCase.m_type);
  return bVar4;
}

Assistant:

bool checkTextureState (glu::CallLogWrapper& gl, const TextureGenerationSpec& spec)
	{
		const int	initialValue	= 0;
		bool		allOk			= true;

		if (spec.levels.empty())
		{
			const int queryLevel	= 0;
			const int refValue		= initialValue;

			allOk &= verifyTextureLevelParameterEqual(gl, spec.queryTarget, queryLevel, GL_TEXTURE_WIDTH, refValue, m_type);
		}
		else
		{
			for (int levelNdx = 0; levelNdx < (int)spec.levels.size(); ++levelNdx)
			{
				const int queryLevel	= spec.levels[levelNdx].level;
				const int refValue		= spec.levels[levelNdx].width;

				allOk &= verifyTextureLevelParameterEqual(gl, spec.queryTarget, queryLevel, GL_TEXTURE_WIDTH, refValue, m_type);
			}
		}

		return allOk;
	}